

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maph.h
# Opt level: O2

void printBounds(Settings *s)

{
  ostream *poVar1;
  
  std::operator<<((ostream *)&std::cout,"Bounds:\n\t");
  poVar1 = std::ostream::_M_insert<double>(s->minx);
  std::operator<<(poVar1," <= x <= ");
  poVar1 = std::ostream::_M_insert<double>(s->maxx);
  std::operator<<(poVar1,"\n\t");
  poVar1 = std::ostream::_M_insert<double>(s->miny);
  std::operator<<(poVar1," <= y <= ");
  poVar1 = std::ostream::_M_insert<double>(s->maxy);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void printBounds(const Settings& s)
{
	std::cout << "Bounds:\n\t"
			<< s.minx << " <= x <= " << s.maxx
			<< "\n\t"
			<< s.miny << " <= y <= " << s.maxy
			<< std::endl;
}